

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O2

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
Distributions::toCDF(Distributions *this,vector<double,_std::allocator<double>_> *distribution)

{
  value_type *pvVar1;
  pointer pdVar2;
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar3;
  ulong __n;
  uint uVar4;
  allocator_type local_41;
  value_type local_40;
  double local_38;
  value_type_conflict4 local_30;
  
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3,&local_30,&local_41);
  *(vector<double,_std::allocator<double>_> **)this = this_00;
  pvVar1 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pvVar1) {
    local_40 = *pvVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,0);
    *pvVar3 = local_40;
    uVar4 = 0;
    while( true ) {
      __n = (ulong)(uVar4 + 1);
      pdVar2 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) <= __n) break;
      local_40 = pdVar2[__n];
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,(ulong)uVar4);
      local_38 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
      *pvVar3 = local_40 + local_38;
      uVar4 = uVar4 + 1;
    }
  }
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<double> > Distributions::toCDF(const vector<double>& distribution) {
	unique_ptr<vector<double> > result(new vector<double>(distribution.size(), 0.0));
	if (distribution.size() == 0) return result;
	result->at(0) = distribution[0];
	for (unsigned int i=1; i<distribution.size(); ++i) {
		result->at(i) = distribution[i] + result->at(i-1);
	}
	return result;
}